

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetEpsLin(void *arkode_mem,realtype eplifac)

{
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKodeMem local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_38 = in_XMM0_Qa;
  local_4 = arkLs_AccessLMem(in_XMM0_Qa,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if ((double)local_38 <= 0.0) {
      local_38 = (ARKodeMem)0x3fa999999999999a;
    }
    in_stack_ffffffffffffffd8[5] = local_38;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetEpsLin(void *arkode_mem, realtype eplifac)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetEpsLin",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  arkls_mem->eplifac = (eplifac <= ZERO) ? ARKLS_EPLIN : eplifac;

  return(ARKLS_SUCCESS);
}